

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O1

ON_Interval __thiscall ON_PolylineCurve::Domain(ON_PolylineCurve *this)

{
  double t0;
  double t1;
  double *pdVar1;
  uint uVar2;
  ON_Interval d;
  ON_Interval local_18;
  
  ON_Interval::ON_Interval(&local_18);
  uVar2 = ON_Polyline::PointCount(&this->m_pline);
  if (1 < (int)uVar2) {
    pdVar1 = (this->m_t).m_a;
    t0 = *pdVar1;
    t1 = pdVar1[(ulong)uVar2 - 1];
    if (t0 < t1) {
      ON_Interval::Set(&local_18,t0,t1);
    }
  }
  return (ON_Interval)local_18.m_t;
}

Assistant:

ON_Interval ON_PolylineCurve::Domain() const
{
  ON_Interval d;
  //bool rc = false;
  const int count = PointCount();
  if ( count >= 2 && m_t[0] < m_t[count-1] ) {
    d.Set(m_t[0],m_t[count-1]);
  }
  return d;
}